

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

void xfer_cleanup(fxp_xfer *xfer)

{
  req *ptr;
  
  ptr = xfer->head;
  while (ptr != (req *)0x0) {
    xfer->head = ptr->next;
    safefree(ptr->buffer);
    safefree(ptr);
    ptr = xfer->head;
  }
  safefree(xfer);
  return;
}

Assistant:

void xfer_cleanup(struct fxp_xfer *xfer)
{
    struct req *rr;
    while (xfer->head) {
        rr = xfer->head;
        xfer->head = xfer->head->next;
        sfree(rr->buffer);
        sfree(rr);
    }
    sfree(xfer);
}